

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O3

int PackBitsEncode(TIFF *tif,uint8_t *buf,tmsize_t cc,uint16_t s)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte *local_40;
  ulong local_38;
  
  pbVar9 = tif->tif_rawcp;
  pbVar7 = pbVar9;
  if (0 < cc) {
    puVar3 = tif->tif_rawdata;
    lVar4 = tif->tif_rawdatasize;
    bVar5 = 0;
    pbVar9 = (byte *)0x0;
LAB_002aad8e:
    bVar1 = *buf;
    if ((ulong)cc < 2) {
      local_40 = buf + 1;
      uVar12 = 1;
      local_38 = 0;
    }
    else {
      local_40 = buf + cc;
      local_38 = cc - 1;
      uVar12 = 1;
      do {
        if (bVar1 != buf[uVar12]) {
          local_40 = buf + uVar12;
          goto LAB_002aadfe;
        }
        uVar12 = uVar12 + 1;
        local_38 = local_38 - 1;
      } while (local_38 != 0);
      local_38 = 0;
      uVar12 = cc;
    }
LAB_002aadfe:
    while( true ) {
      pbVar8 = pbVar9;
      if (puVar3 + lVar4 <= pbVar7 + 2) {
        if ((bVar5 & 0xfd) == 1) {
          tif->tif_rawcc = (tmsize_t)(pbVar9 + (tif->tif_rawcc - (long)tif->tif_rawcp));
          iVar6 = TIFFFlushData1(tif);
          if (iVar6 == 0) {
            return 0;
          }
          lVar10 = (long)pbVar7 - (long)pbVar9;
          pbVar7 = tif->tif_rawcp;
          pbVar8 = pbVar7;
          if (0 < lVar10) {
            uVar11 = lVar10 + 1;
            do {
              bVar2 = *pbVar9;
              pbVar9 = pbVar9 + 1;
              *pbVar7 = bVar2;
              pbVar7 = pbVar7 + 1;
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            pbVar8 = tif->tif_rawcp;
          }
        }
        else {
          tif->tif_rawcc = (tmsize_t)(pbVar7 + (tif->tif_rawcc - (long)tif->tif_rawcp));
          iVar6 = TIFFFlushData1(tif);
          if (iVar6 == 0) {
            return 0;
          }
          pbVar7 = tif->tif_rawcp;
        }
      }
      pbVar9 = pbVar8;
      if (bVar5 != 3) break;
      bVar5 = 2;
      if (((uVar12 == 1) && (pbVar7[-2] == 0xff)) && (*pbVar8 < 0x7e)) {
        bVar5 = *pbVar8 + 2;
        *pbVar8 = bVar5;
        bVar5 = bVar5 != 0x7f;
        pbVar7[-2] = pbVar7[-1];
      }
    }
    if ((bVar5 == 2) || (bVar5 != 1)) {
      if ((long)uVar12 < 2) {
        pbVar8 = pbVar7 + 1;
        *pbVar7 = 0;
        bVar5 = 1;
        lVar10 = 2;
        pbVar9 = pbVar7;
        goto LAB_002aafc3;
      }
      bVar5 = 2;
      if (uVar12 < 0x81) {
        *pbVar7 = 1 - (char)uVar12;
        bVar5 = 2;
        goto LAB_002aafbe;
      }
    }
    else {
      if ((long)uVar12 < 2) {
        bVar5 = *pbVar8;
        *pbVar8 = bVar5 + 1;
        bVar5 = (byte)(bVar5 + 1) != 0x7f;
        lVar10 = 1;
        pbVar8 = pbVar7;
        goto LAB_002aafc3;
      }
      bVar5 = 3;
      if (uVar12 < 0x81) goto LAB_002aafaa;
    }
    *pbVar7 = 0x81;
    pbVar7[1] = bVar1;
    uVar12 = uVar12 - 0x80;
    pbVar7 = pbVar7 + 2;
    goto LAB_002aadfe;
  }
LAB_002aafef:
  tif->tif_rawcc = (tmsize_t)(pbVar7 + (tif->tif_rawcc - (long)pbVar9));
  tif->tif_rawcp = pbVar7;
  return 1;
LAB_002aafaa:
  *pbVar7 = 1 - (char)uVar12;
  bVar5 = 3;
LAB_002aafbe:
  lVar10 = 2;
  pbVar8 = pbVar7 + 1;
LAB_002aafc3:
  pbVar7 = pbVar7 + lVar10;
  *pbVar8 = bVar1;
  cc = local_38;
  buf = local_40;
  if ((long)local_38 < 1) goto code_r0x002aafdf;
  goto LAB_002aad8e;
code_r0x002aafdf:
  pbVar9 = tif->tif_rawcp;
  goto LAB_002aafef;
}

Assistant:

static int PackBitsEncode(TIFF *tif, uint8_t *buf, tmsize_t cc, uint16_t s)
{
    unsigned char *bp = (unsigned char *)buf;
    uint8_t *op;
    uint8_t *ep;
    uint8_t *lastliteral;
    long n, slop;
    int b;
    enum
    {
        BASE,
        LITERAL,
        RUN,
        LITERAL_RUN
    } state;

    (void)s;
    op = tif->tif_rawcp;
    ep = tif->tif_rawdata + tif->tif_rawdatasize;
    state = BASE;
    lastliteral = 0;
    while (cc > 0)
    {
        /*
         * Find the longest string of identical bytes.
         */
        b = *bp++;
        cc--;
        n = 1;
        for (; cc > 0 && b == *bp; cc--, bp++)
            n++;
    again:
        if (op + 2 >= ep)
        { /* insure space for new data */
            /*
             * Be careful about writing the last
             * literal.  Must write up to that point
             * and then copy the remainder to the
             * front of the buffer.
             */
            if (state == LITERAL || state == LITERAL_RUN)
            {
                slop = (long)(op - lastliteral);
                tif->tif_rawcc += (tmsize_t)(lastliteral - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                while (slop-- > 0)
                    *op++ = *lastliteral++;
                lastliteral = tif->tif_rawcp;
            }
            else
            {
                tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
            }
        }
        switch (state)
        {
            case BASE: /* initial state, set run/literal */
                if (n > 1)
                {
                    state = RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL: /* last object was literal string */
                if (n > 1)
                {
                    state = LITERAL_RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1)); /* encode run */
                    *op++ = (uint8_t)b;
                }
                else
                { /* extend literal */
                    if (++(*lastliteral) == 127)
                        state = BASE;
                    *op++ = (uint8_t)b;
                }
                break;
            case RUN: /* last object was run */
                if (n > 1)
                {
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL_RUN: /* literal followed by a run */
                /*
                 * Check to see if previous run should
                 * be converted to a literal, in which
                 * case we convert literal-run-literal
                 * to a single literal.
                 */
                if (n == 1 && op[-2] == (uint8_t)-1 && *lastliteral < 126)
                {
                    state = (((*lastliteral) += 2) == 127 ? BASE : LITERAL);
                    op[-2] = op[-1]; /* replicate */
                }
                else
                    state = RUN;
                goto again;
        }
    }
    tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
    tif->tif_rawcp = op;
    return (1);
}